

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
brotli::MoveToFrontTransform
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  uint uVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __result;
  uint *puVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  size_t __n;
  long lVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> mtf;
  allocator_type local_71;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  puVar4 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 == puVar2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__,v);
  }
  else {
    puVar6 = puVar4 + 1;
    if (puVar6 != puVar2) {
      uVar9 = *puVar4;
      do {
        uVar1 = *puVar6;
        bVar11 = uVar9 < uVar1;
        if (uVar9 <= uVar1) {
          uVar9 = uVar1;
        }
        if (bVar11) {
          puVar4 = puVar6;
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar2);
    }
    uVar1 = *puVar4;
    uVar9 = uVar1 + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_48,(ulong)uVar9,&local_71);
    auVar3 = _DAT_001b78d0;
    uVar5 = (ulong)(uVar1 + 1 + (uint)(uVar9 == 0));
    lVar8 = uVar5 - 1;
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar12 = auVar12 ^ _DAT_001b78d0;
    auVar13 = _DAT_001b6f00;
    do {
      auVar14 = auVar13 ^ auVar3;
      if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                  auVar12._4_4_ < auVar14._4_4_) & 1)) {
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = (uint)uVar7;
      }
      if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
          auVar14._12_4_ <= auVar12._12_4_) {
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 + 1] = (uint)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar8 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar8 + 2;
    } while ((uVar5 + 1 & 0xfffffffffffffffe) != uVar7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_71);
    local_50 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    lVar8 = (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)local_50;
    local_70 = __return_storage_ptr__;
    if (lVar8 == 0) {
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      lVar8 = lVar8 >> 2;
      local_58 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar7 = (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      local_60 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      local_68 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
      lVar10 = 0;
      do {
        if (local_58 ==
            local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
LAB_0017769c:
          __assert_fail("index < mtf.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/brotli_bit_stream.cc"
                        ,0x1ed,
                        "std::vector<uint32_t> brotli::MoveToFrontTransform(const std::vector<uint32_t> &)"
                       );
        }
        __n = 0;
        uVar5 = 0;
        while (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5] != local_50[lVar10]) {
          uVar5 = uVar5 + 1;
          __n = __n + 4;
          if (uVar7 + (uVar7 == 0) == uVar5) goto LAB_0017769c;
        }
        if (uVar7 <= uVar5) goto LAB_0017769c;
        local_60[lVar10] = (uint)uVar5;
        uVar9 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        if (uVar5 != 0) {
          memmove(local_68,local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,__n);
        }
        *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = uVar9;
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
    }
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__ = local_70;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MoveToFrontTransform(const std::vector<uint32_t>& v) {
  if (v.empty()) return v;
  uint32_t max_value = *std::max_element(v.begin(), v.end());
  std::vector<uint32_t> mtf(max_value + 1);
  for (uint32_t i = 0; i <= max_value; ++i) mtf[i] = i;
  std::vector<uint32_t> result(v.size());
  for (size_t i = 0; i < v.size(); ++i) {
    size_t index = IndexOf(mtf, v[i]);
    assert(index < mtf.size());
    result[i] = static_cast<uint32_t>(index);
    MoveToFront(&mtf, index);
  }
  return result;
}